

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

MacroFormalArgumentListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MacroFormalArgumentListSyntax,slang::syntax::MacroFormalArgumentListSyntax_const&>
          (BumpAllocator *this,MacroFormalArgumentListSyntax *args)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  size_t sVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  MacroFormalArgumentListSyntax *pMVar8;
  
  pMVar8 = (MacroFormalArgumentListSyntax *)allocate(this,0x70,8);
  (pMVar8->super_SyntaxNode).previewNode = (args->super_SyntaxNode).previewNode;
  uVar4 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  (pMVar8->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pMVar8->super_SyntaxNode).field_0x4 = uVar4;
  (pMVar8->super_SyntaxNode).parent = pSVar1;
  uVar5 = (args->openParen).field_0x2;
  NVar6.raw = (args->openParen).numFlags.raw;
  uVar7 = (args->openParen).rawLen;
  pIVar2 = (args->openParen).info;
  (pMVar8->openParen).kind = (args->openParen).kind;
  (pMVar8->openParen).field_0x2 = uVar5;
  (pMVar8->openParen).numFlags = (NumericTokenFlags)NVar6.raw;
  (pMVar8->openParen).rawLen = uVar7;
  (pMVar8->openParen).info = pIVar2;
  (pMVar8->args).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->args).super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->args).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->args).super_SyntaxListBase.super_SyntaxNode.parent;
  (pMVar8->args).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->args).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pMVar8->args).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pMVar8->args).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pMVar8->args).super_SyntaxListBase.childCount = (args->args).super_SyntaxListBase.childCount;
  (pMVar8->args).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005a3a48;
  sVar3 = (args->args).elements._M_extent._M_extent_value;
  (pMVar8->args).elements._M_ptr = (args->args).elements._M_ptr;
  (pMVar8->args).elements._M_extent._M_extent_value = sVar3;
  uVar5 = (args->closeParen).field_0x2;
  NVar6.raw = (args->closeParen).numFlags.raw;
  uVar7 = (args->closeParen).rawLen;
  pIVar2 = (args->closeParen).info;
  (pMVar8->closeParen).kind = (args->closeParen).kind;
  (pMVar8->closeParen).field_0x2 = uVar5;
  (pMVar8->closeParen).numFlags = (NumericTokenFlags)NVar6.raw;
  (pMVar8->closeParen).rawLen = uVar7;
  (pMVar8->closeParen).info = pIVar2;
  return pMVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }